

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

void __thiscall dtc::fdt::device_tree::write<dtc::dtb::asm_writer>(device_tree *this,int fd)

{
  pointer ppVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  uint32_t i_2;
  pair<unsigned_long,_unsigned_long> *i;
  pointer ppVar5;
  uint32_t i_1;
  uint uVar6;
  allocator<char> local_16d;
  int local_16c;
  string local_168;
  asm_writer struct_writer;
  asm_writer strings_writer;
  asm_writer reservation_writer;
  header head;
  asm_writer head_writer;
  string_table st;
  
  head.magic = 0xd00dfeed;
  head.version = 0x11;
  head.last_comp_version = 0x10;
  st.string_offsets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &st.string_offsets._M_t._M_impl.super__Rb_tree_header._M_header;
  st.string_offsets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  st.string_offsets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  st.size = 0;
  head.boot_cpuid_phys = 0;
  st.string_offsets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  st.strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  st.strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  st.strings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  head_writer.super_output_writer._vptr_output_writer = (_func_int **)&PTR_write_label_0014f0f0;
  head_writer.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  head_writer.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  head_writer.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  head_writer.byte_count = 0;
  head_writer.bytes_written = 0;
  reservation_writer.super_output_writer._vptr_output_writer =
       (_func_int **)&PTR_write_label_0014f0f0;
  reservation_writer.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  reservation_writer.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  reservation_writer.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reservation_writer.byte_count = 0;
  reservation_writer.bytes_written = 0;
  struct_writer.super_output_writer._vptr_output_writer = (_func_int **)&PTR_write_label_0014f0f0;
  struct_writer.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  struct_writer.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  struct_writer.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  struct_writer.byte_count = 0;
  struct_writer.bytes_written = 0;
  strings_writer.super_output_writer._vptr_output_writer = (_func_int **)&PTR_write_label_0014f0f0;
  strings_writer.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  strings_writer.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  strings_writer.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  strings_writer.byte_count = 0;
  strings_writer.bytes_written = 0;
  local_16c = fd;
  st.string_offsets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       st.string_offsets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"Memory reservations",&local_16d);
  dtb::asm_writer::write_comment(&reservation_writer,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"dt_reserve_map",&local_16d);
  dtb::asm_writer::write_label(&reservation_writer,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  ppVar1 = (this->reservations).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar5 = (this->reservations).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar1; ppVar5 = ppVar5 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"Reservation start",&local_16d);
    dtb::asm_writer::write_comment(&reservation_writer,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    dtb::asm_writer::write_data(&reservation_writer,ppVar5->first);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"Reservation length",&local_16d);
    dtb::asm_writer::write_comment(&reservation_writer,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    dtb::asm_writer::write_data(&reservation_writer,ppVar5->second);
  }
  for (uVar6 = 0; uVar6 <= this->spare_reserve_map_entries; uVar6 = uVar6 + 1) {
    dtb::asm_writer::write_data(&reservation_writer,0);
    dtb::asm_writer::write_data(&reservation_writer,0);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"Device tree",&local_16d);
  dtb::asm_writer::write_comment(&struct_writer,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"dt_struct_start",&local_16d);
  dtb::asm_writer::write_label(&struct_writer,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  node::write((this->root).super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
              (int)&struct_writer,&st,in_RCX);
  dtb::output_writer::write_token(&struct_writer.super_output_writer,FDT_END);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"dt_struct_end",&local_16d);
  dtb::asm_writer::write_label(&struct_writer,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  dtb::string_table::write(&st,(int)&strings_writer,__buf,in_RCX);
  head.size_dt_strings = dtb::asm_writer::size(&strings_writer);
  for (uVar6 = 0; uVar6 < this->blob_padding; uVar6 = uVar6 + 1) {
    dtb::asm_writer::write_data(&strings_writer,'\0');
  }
  uVar2 = dtb::asm_writer::size(&strings_writer);
  uVar3 = dtb::asm_writer::size(&struct_writer);
  uVar4 = dtb::asm_writer::size(&reservation_writer);
  uVar6 = uVar4 + uVar2 + uVar3 + 0x28;
  head.totalsize = uVar6;
  while (uVar6 < this->minimum_blob_size) {
    uVar6 = uVar6 + 1;
    head.totalsize = uVar6;
    dtb::asm_writer::write_data(&strings_writer,'\0');
  }
  uVar2 = dtb::asm_writer::size(&reservation_writer);
  head.off_dt_struct = uVar2 + 0x28;
  uVar3 = dtb::asm_writer::size(&struct_writer);
  head.off_dt_strings = uVar3 + uVar2 + 0x28;
  head.off_mem_rsvmap = 0x28;
  head.boot_cpuid_phys = this->boot_cpu;
  head.size_dt_struct = dtb::asm_writer::size(&struct_writer);
  dtb::header::write(&head,(int)&head_writer,__buf_00,in_RCX);
  dtb::asm_writer::write_to_file(&head_writer,local_16c);
  dtb::asm_writer::write_to_file(&reservation_writer,local_16c);
  dtb::asm_writer::write_to_file(&struct_writer,local_16c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"dt_blob_end",&local_16d);
  dtb::asm_writer::write_label(&strings_writer,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  dtb::asm_writer::write_to_file(&strings_writer,local_16c);
  dtb::asm_writer::~asm_writer(&strings_writer);
  dtb::asm_writer::~asm_writer(&struct_writer);
  dtb::asm_writer::~asm_writer(&reservation_writer);
  dtb::asm_writer::~asm_writer(&head_writer);
  dtb::string_table::~string_table(&st);
  return;
}

Assistant:

void
device_tree::write(int fd)
{
	dtb::string_table st;
	dtb::header head;
	writer head_writer;
	writer reservation_writer;
	writer struct_writer;
	writer strings_writer;

	// Build the reservation table
	reservation_writer.write_comment(string("Memory reservations"));
	reservation_writer.write_label(string("dt_reserve_map"));
	for (auto &i : reservations)
	{
		reservation_writer.write_comment(string("Reservation start"));
		reservation_writer.write_data(i.first);
		reservation_writer.write_comment(string("Reservation length"));
		reservation_writer.write_data(i.second);
	}
	// Write n spare reserve map entries, plus the trailing 0.
	for (uint32_t i=0 ; i<=spare_reserve_map_entries ; i++)
	{
		reservation_writer.write_data((uint64_t)0);
		reservation_writer.write_data((uint64_t)0);
	}


	struct_writer.write_comment(string("Device tree"));
	struct_writer.write_label(string("dt_struct_start"));
	root->write(struct_writer, st);
	struct_writer.write_token(dtb::FDT_END);
	struct_writer.write_label(string("dt_struct_end"));

	st.write(strings_writer);
	// Find the strings size before we stick padding on the end.
	// Note: We should possibly use a new writer for the padding.
	head.size_dt_strings = strings_writer.size();

	// Stick the padding in the strings writer, but after the
	// marker indicating that it's the end.
	// Note: We probably should add a padding call to the writer so
	// that the asm back end can write padding directives instead
	// of a load of 0 bytes.
	for (uint32_t i=0 ; i<blob_padding ; i++)
	{
		strings_writer.write_data((uint8_t)0);
	}
	head.totalsize = sizeof(head) + strings_writer.size() +
		struct_writer.size() + reservation_writer.size();
	while (head.totalsize < minimum_blob_size)
	{
		head.totalsize++;
		strings_writer.write_data((uint8_t)0);
	}
	head.off_dt_struct = sizeof(head) + reservation_writer.size();;
	head.off_dt_strings = head.off_dt_struct + struct_writer.size();
	head.off_mem_rsvmap = sizeof(head);
	head.boot_cpuid_phys = boot_cpu;
	head.size_dt_struct = struct_writer.size();
	head.write(head_writer);

	head_writer.write_to_file(fd);
	reservation_writer.write_to_file(fd);
	struct_writer.write_to_file(fd);
	strings_writer.write_label(string("dt_blob_end"));
	strings_writer.write_to_file(fd);
}